

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall Am_Object::Is_Part_Of(Am_Object *this,Am_Object *in_owner)

{
  Am_Object_Data *local_28;
  Am_Object_Data *current;
  Am_Object *in_owner_local;
  Am_Object *this_local;
  
  local_28 = this->data;
  while( true ) {
    if (local_28 == (Am_Object_Data *)0x0) {
      return false;
    }
    if (local_28 == in_owner->data) break;
    local_28 = (Am_Object_Data *)(local_28->owner_slot).super_Am_Value.value.proc_value;
  }
  return true;
}

Assistant:

bool
Am_Object::Is_Part_Of(Am_Object in_owner) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_owner.data)
      return true;
    current = (Am_Object_Data *)current->owner_slot.value.wrapper_value;
  }
  return false;
}